

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::ParseBigVarint(char *p,uint64_t *out)

{
  uint32_t uVar1;
  uint local_3c;
  ulong uStack_38;
  uint32_t i;
  uint64_t res;
  char *pcStack_28;
  uint32_t tmp;
  char *pnew;
  uint64_t *out_local;
  char *p_local;
  
  pcStack_28 = p;
  pnew = (char *)out;
  out_local = (uint64_t *)p;
  uVar1 = DecodeTwoBytes(&stack0xffffffffffffffd8);
  uStack_38 = (ulong)(uVar1 >> 1);
  if ((short)uVar1 < 0) {
    for (local_3c = 1; local_3c < 5; local_3c = local_3c + 1) {
      pcStack_28 = (char *)((long)out_local + (ulong)(local_3c << 1));
      uVar1 = DecodeTwoBytes(&stack0xffffffffffffffd8);
      uStack_38 = ((ulong)uVar1 - 2 << ((char)local_3c * '\x0e' - 1U & 0x3f)) + uStack_38;
      if (-1 < (short)uVar1) {
        *(ulong *)pnew = uStack_38;
        return pcStack_28;
      }
    }
    p_local = (char *)0x0;
  }
  else {
    *(ulong *)pnew = uStack_38;
    p_local = pcStack_28;
  }
  return p_local;
}

Assistant:

inline const char* ParseBigVarint(const char* p, uint64_t* out) {
  auto pnew = p;
  auto tmp = DecodeTwoBytes(&pnew);
  uint64_t res = tmp >> 1;
  if (ABSL_PREDICT_TRUE(static_cast<std::int16_t>(tmp) >= 0)) {
    *out = res;
    return pnew;
  }
  for (std::uint32_t i = 1; i < 5; i++) {
    pnew = p + 2 * i;
    tmp = DecodeTwoBytes(&pnew);
    res += (static_cast<std::uint64_t>(tmp) - 2) << (14 * i - 1);
    if (ABSL_PREDICT_TRUE(static_cast<std::int16_t>(tmp) >= 0)) {
      *out = res;
      return pnew;
    }
  }
  return nullptr;
}